

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext *ctx,ExprFunctionDefinition *node)

{
  uint uVar1;
  LLVMValueRefOpaque *pLVar2;
  VariableData *pVVar3;
  char *pcVar4;
  LLVMBasicBlockRefOpaque **ppLVar5;
  TypeBase *type;
  SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U> *this;
  int iVar6;
  LLVMValueRef pLVar7;
  undefined4 extraout_var;
  LLVMValueRefOpaque **ppLVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FunctionData *pFVar9;
  ScopeData *pSVar10;
  VariableHandle *pVVar11;
  uint uVar12;
  ulong uVar13;
  ExprFunctionDefinition *pEVar14;
  ulong uVar15;
  ExprBase *expression;
  LLVMValueRef storage;
  LLVMValueRefOpaque *local_58;
  ExprFunctionDefinition *local_50;
  FunctionData *local_48;
  LLVMValueRef local_40;
  SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U> *local_38;
  
  pFVar9 = node->function;
  if ((ctx->functions).count <= pFVar9->functionIndex) {
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<LLVMValueRefOpaque *, 128>::operator[](unsigned int) [T = LLVMValueRefOpaque *, N = 128]"
                 );
  }
  if (ctx->skipFunctionDefinitions == true) {
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,(node->super_ExprBase).type);
    pLVar7 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
    return pLVar7;
  }
  if (pFVar9->isPrototype == false) {
    pLVar2 = (ctx->functions).data[pFVar9->functionIndex];
    ctx->skipFunctionDefinitions = true;
    local_40 = ctx->currentFunction;
    local_48 = ctx->currentFunctionSource;
    ctx->currentFunction = pLVar2;
    ctx->currentFunctionSource = pFVar9;
    local_50 = node;
    if (ctx->currentNextRestoreBlock != 0) {
      __assert_fail("ctx.currentNextRestoreBlock == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x6a9,
                    "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                   );
    }
    if ((ctx->currentRestoreBlocks).count != 0) {
      __assert_fail("ctx.currentRestoreBlocks.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x6aa,
                    "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                   );
    }
    pVVar11 = (pFVar9->argumentVariables).head;
    if (pVVar11 != (VariableHandle *)0x0) {
      do {
        pVVar3 = pVVar11->variable;
        CompileLlvmType(ctx,pVVar3->type);
        pcVar4 = (pVVar3->name->name).begin;
        uVar15 = (long)(pVVar3->name->name).end - (long)pcVar4;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar15 + 1));
        uVar15 = uVar15 & 0xffffffff;
        memcpy((void *)CONCAT44(extraout_var,iVar6),pcVar4,uVar15);
        *(undefined1 *)((long)CONCAT44(extraout_var,iVar6) + uVar15) = 0;
        local_58 = (LLVMValueRefOpaque *)&placeholderValue;
        ppLVar8 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                  ::find(&ctx->variables,&pVVar3->uniqueId);
        if (ppLVar8 != (LLVMValueRefOpaque **)0x0) {
          __assert_fail("!ctx.variables.find(variable->uniqueId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                        ,0x6ca,
                        "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                       );
        }
        SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                  (&ctx->variables,&pVVar3->uniqueId,&local_58);
        pVVar11 = pVVar11->next;
      } while (pVVar11 != (VariableHandle *)0x0);
    }
    pEVar14 = local_50;
    pVVar3 = local_50->function->contextArgument;
    if (pVVar3 != (VariableData *)0x0) {
      CompileLlvmType(ctx,pVVar3->type);
      pcVar4 = (pVVar3->name->name).begin;
      uVar15 = (long)(pVVar3->name->name).end - (long)pcVar4;
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar15 + 1));
      uVar15 = uVar15 & 0xffffffff;
      memcpy((void *)CONCAT44(extraout_var_00,iVar6),pcVar4,uVar15);
      *(undefined1 *)((long)CONCAT44(extraout_var_00,iVar6) + uVar15) = 0;
      local_58 = (LLVMValueRefOpaque *)&placeholderValue;
      CompileLlvmType(ctx,pEVar14->function->contextType);
      ppLVar8 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                ::find(&ctx->variables,&pVVar3->uniqueId);
      if (ppLVar8 != (LLVMValueRefOpaque **)0x0) {
        __assert_fail("!ctx.variables.find(variable->uniqueId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x6da,
                      "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                     );
      }
      SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                (&ctx->variables,&pVVar3->uniqueId,&local_58);
    }
    pFVar9 = pEVar14->function;
    pSVar10 = pFVar9->functionScope;
    if ((pSVar10->allVariables).count != 0) {
      local_38 = &ctx->variables;
      uVar15 = 0;
      do {
        pVVar3 = (pSVar10->allVariables).data[uVar15];
        for (pVVar11 = (pFVar9->argumentVariables).head; pVVar11 != (VariableHandle *)0x0;
            pVVar11 = pVVar11->next) {
          if (pVVar3 == pVVar11->variable) goto LAB_00186b61;
        }
        if (pVVar3 != pFVar9->contextArgument) {
          CompileLlvmType(ctx,pVVar3->type);
          pcVar4 = (pVVar3->name->name).begin;
          uVar13 = (long)(pVVar3->name->name).end - (long)pcVar4;
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar13 + 1));
          this = local_38;
          uVar13 = uVar13 & 0xffffffff;
          memcpy((void *)CONCAT44(extraout_var_01,iVar6),pcVar4,uVar13);
          *(undefined1 *)((long)CONCAT44(extraout_var_01,iVar6) + uVar13) = 0;
          local_58 = (LLVMValueRefOpaque *)&placeholderValue;
          ppLVar8 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                    ::find(this,&pVVar3->uniqueId);
          if (ppLVar8 != (LLVMValueRefOpaque **)0x0) {
            __assert_fail("!ctx.variables.find(variable->uniqueId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                          ,0x6f4,
                          "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                         );
          }
          SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
          insert(this,&pVVar3->uniqueId,&local_58);
          pEVar14 = local_50;
        }
LAB_00186b61:
        uVar15 = uVar15 + 1;
        pFVar9 = pEVar14->function;
        pSVar10 = pFVar9->functionScope;
      } while (uVar15 < (pSVar10->allVariables).count);
    }
    if (pFVar9->coroutine != false) {
      CompileLlvm(ctx,pEVar14->coroutineStateRead);
      if (pEVar14->function->yieldCount != 0) {
        uVar12 = 0;
        do {
          CompileLlvmType(ctx,ctx->ctx->typeInt);
          uVar1 = (ctx->currentRestoreBlocks).count;
          if (uVar1 == (ctx->currentRestoreBlocks).max) {
            SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::grow(&ctx->currentRestoreBlocks,uVar1);
          }
          ppLVar5 = (ctx->currentRestoreBlocks).data;
          if (ppLVar5 == (LLVMBasicBlockRefOpaque **)0x0) {
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<LLVMBasicBlockRefOpaque *, 16>::push_back(const T &) [T = LLVMBasicBlockRefOpaque *, N = 16]"
                         );
          }
          uVar12 = uVar12 + 1;
          uVar1 = (ctx->currentRestoreBlocks).count;
          (ctx->currentRestoreBlocks).count = uVar1 + 1;
          ppLVar5[uVar1] = (LLVMBasicBlockRefOpaque *)&placeholderBasicBlock;
        } while (uVar12 < pEVar14->function->yieldCount);
      }
    }
    for (expression = (pEVar14->expressions).head; expression != (ExprBase *)0x0;
        expression = expression->next) {
      CompileLlvm(ctx,expression);
    }
    type = pEVar14->function->type->returnType;
    if (type != ctx->ctx->typeVoid) {
      CompileLlvmType(ctx,type);
    }
    ctx->currentFunction = local_40;
    ctx->currentFunctionSource = local_48;
    ctx->currentNextRestoreBlock = 0;
    (ctx->currentRestoreBlocks).count = 0;
    ctx->skipFunctionDefinitions = false;
  }
  return (LLVMValueRef)0x0;
}

Assistant:

LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &ctx, ExprFunctionDefinition *node)
{
	LLVMValueRef function = ctx.functions[node->function->functionIndex];

	if(ctx.skipFunctionDefinitions)
	{
		LLVMValueRef function = LLVMBuildPointerCast(ctx.builder, ctx.functions[node->function->functionIndex], CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "func_ptr");

		LLVMValueRef constants[] = { LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)), LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)) };

		LLVMValueRef result = LLVMConstNamedStruct(CompileLlvmType(ctx, node->type), constants, 2);

		result = LLVMBuildInsertValue(ctx.builder, result, function, 1, "");

		return CheckType(ctx, node, result);
	}

	if(node->function->isPrototype)
		return NULL;

	ctx.skipFunctionDefinitions = true;

	// Store state
	LLVMValueRef currentFunction = ctx.currentFunction;
	FunctionData *currentFunctionSource = ctx.currentFunctionSource;

	// Switch to new function
	ctx.currentFunction = function;
	ctx.currentFunctionSource = node->function;

	assert(ctx.currentNextRestoreBlock == 0);
	assert(ctx.currentRestoreBlocks.empty());

	LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

	LLVMPositionBuilderAtEnd(ctx.builder, block);

	// Allocate all arguments
	unsigned argIndex = 0;

	if(IsStructReturnType(node->function->type->returnType))
		argIndex++;

	for(VariableHandle *curr = node->function->argumentVariables.head; curr; curr = curr->next)
	{
		VariableData *variable = curr->variable;

		if(IsStructArgumentType(variable->type))
		{
			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, argument);
		}
		else
		{
			LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			LLVMBuildStore(ctx.builder, argument, storage);

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, storage);
		}
	}

	if(VariableData *variable = node->function->contextArgument)
	{
		LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

		LLVMValueRef argument = LLVMGetParam(function, argIndex++);

		argument = LLVMBuildPointerCast(ctx.builder, argument, CompileLlvmType(ctx, node->function->contextType), "context_reinterpret");

		LLVMBuildStore(ctx.builder, argument, storage);

		assert(!ctx.variables.find(variable->uniqueId));

		ctx.variables.insert(variable->uniqueId, storage);
	}

	// Generate variables for all locals
	for(unsigned i = 0; i < node->function->functionScope->allVariables.size(); i++)
	{
		VariableData *variable = node->function->functionScope->allVariables[i];

		bool isArgument = false;

		for(VariableHandle *curr = node->function->argumentVariables.head; curr; curr = curr->next)
		{
			if(variable == curr->variable)
			{
				isArgument = true;
				break;
			}
		}

		if(isArgument || variable == node->function->contextArgument)
			continue;

		LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

		assert(!ctx.variables.find(variable->uniqueId));

		ctx.variables.insert(variable->uniqueId, storage);
	}

	if(node->function->coroutine)
	{
		LLVMValueRef state = CompileLlvm(ctx, node->coroutineStateRead);

		LLVMBasicBlockRef startBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

		LLVMValueRef switchInst = LLVMBuildSwitch(ctx.builder, state, startBlock, node->function->yieldCount);

		LLVMPositionBuilderAtEnd(ctx.builder, startBlock);

		for(unsigned i = 0; i < node->function->yieldCount; i++)
		{
			LLVMBasicBlockRef restoreBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "restore");

			LLVMAddCase(switchInst, LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), i + 1, true), restoreBlock);

			ctx.currentRestoreBlocks.push_back(restoreBlock);
		}
	}

	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileLlvm(ctx, value);

	LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmAbortNoReturn"), NULL, 0, "");

	if(node->function->type->returnType == ctx.ctx.typeVoid || IsStructReturnType(node->function->type->returnType))
		LLVMBuildRetVoid(ctx.builder);
	else
		LLVMBuildRet(ctx.builder, LLVMConstNull(CompileLlvmType(ctx, node->function->type->returnType)));

	CheckFunction(ctx, ctx.currentFunction, node->function->name->name);

	if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
		LLVMRunFunctionPassManager(ctx.functionPassManager, function);

	// Restore state
	ctx.currentFunction = currentFunction;
	ctx.currentFunctionSource = currentFunctionSource;

	ctx.currentNextRestoreBlock = 0;
	ctx.currentRestoreBlocks.clear();

	ctx.skipFunctionDefinitions = false;

	return NULL;
}